

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_relay.cpp
# Opt level: O2

bool __thiscall UDPRelay::AddToLoop(UDPRelay *this,EventLoop *event_loop)

{
  string asStack_28 [32];
  
  if (this->event_loop_ == (EventLoop *)0x0) {
    if (this->is_closed_ != true) {
      this->event_loop_ = event_loop;
      EventLoop::Add(event_loop,this->server_socket_,9,&this->super_ISockNotify);
      return true;
    }
    Log::GetInstance();
    Log::FormatTime_abi_cxx11_();
    std::operator<<((ostream *)&std::cout,asStack_28);
    std::operator<<((ostream *)&std::cout," [warning] ");
    std::operator<<((ostream *)&std::cout,"already closed");
  }
  else {
    Log::GetInstance();
    Log::FormatTime_abi_cxx11_();
    std::operator<<((ostream *)&std::cout,asStack_28);
    std::operator<<((ostream *)&std::cout," [warning] ");
    std::operator<<((ostream *)&std::cout,"already add to loop");
  }
  std::__cxx11::string::~string(asStack_28);
  return false;
}

Assistant:

bool UDPRelay::AddToLoop(EventLoop * event_loop)
{
    if (event_loop_)
    {
        LOGW << "already add to loop";
        return false;
    }
    if (is_closed_)
    {
        LOGW << "already closed";
        return false;
    }
    event_loop_ = event_loop;
    event_loop_->Add(server_socket_, kPollIn | kPollErr, this);
    return true;
}